

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

int side3_2d_filter(double *p0,double *p1,double *p2,double *p3,double *q0,double *q1,double *q2)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  
  dVar34 = *p0;
  dVar42 = p0[1];
  dVar20 = *q0 - dVar34;
  dVar22 = q0[1] - dVar42;
  dVar29 = *q1 - dVar34;
  dVar31 = q1[1] - dVar42;
  dVar39 = *q2 - dVar34;
  dVar17 = q2[1] - dVar42;
  dVar25 = ABS(dVar22);
  if (ABS(dVar22) <= ABS(dVar20)) {
    dVar25 = ABS(dVar20);
  }
  dVar10 = ABS(dVar29);
  if (ABS(dVar29) <= dVar25) {
    dVar10 = dVar25;
  }
  dVar25 = ABS(dVar31);
  if (ABS(dVar31) <= dVar10) {
    dVar25 = dVar10;
  }
  dVar10 = ABS(dVar39);
  if (ABS(dVar39) <= dVar25) {
    dVar10 = dVar25;
  }
  dVar25 = ABS(dVar17);
  if (ABS(dVar17) <= dVar10) {
    dVar25 = dVar10;
  }
  dVar23 = p2[1] - dVar42;
  dVar24 = p1[1] - dVar42;
  dVar35 = *p2 - dVar34;
  dVar38 = *p1 - dVar34;
  auVar27._0_8_ = ABS(dVar23);
  auVar27._8_8_ = ABS(dVar24);
  auVar11._8_4_ = SUB84(ABS(dVar38),0);
  auVar11._0_8_ = ABS(dVar35);
  auVar11._12_4_ = (int)((ulong)ABS(dVar38) >> 0x20);
  auVar11 = maxpd(auVar27,auVar11);
  dVar10 = auVar11._0_8_;
  uVar13 = SUB84(dVar25,0);
  uVar14 = (undefined4)((ulong)dVar25 >> 0x20);
  uVar6 = auVar11._0_4_;
  uVar8 = auVar11._4_4_;
  if ((dVar25 <= dVar10) && (uVar6 = uVar13, uVar8 = uVar14, dVar25 < dVar10)) {
    uVar13 = auVar11._0_4_;
    uVar14 = auVar11._4_4_;
  }
  dVar12 = auVar11._8_8_;
  uVar7 = auVar11._8_4_;
  uVar9 = auVar11._12_4_;
  if (((double)CONCAT44(uVar8,uVar6) < dVar12 || (double)CONCAT44(uVar8,uVar6) == dVar12) &&
     (uVar7 = uVar6, uVar9 = uVar8,
     (double)CONCAT44(uVar14,uVar13) <= dVar12 && dVar12 != (double)CONCAT44(uVar14,uVar13))) {
    uVar13 = auVar11._8_4_;
    uVar14 = auVar11._12_4_;
  }
  iVar4 = 0;
  iVar5 = 0;
  if ((2.7953252803394562e-74 < (double)CONCAT44(uVar9,uVar7) ||
       (double)CONCAT44(uVar9,uVar7) == 2.7953252803394562e-74) &&
     (iVar5 = iVar4,
     (double)CONCAT44(uVar14,uVar13) < 2.596148429267413e+33 ||
     (double)CONCAT44(uVar14,uVar13) == 2.596148429267413e+33)) {
    dVar26 = dVar38 * dVar20 + dVar24 * dVar22;
    dVar36 = dVar38 * dVar29 + dVar24 * dVar31;
    dVar19 = dVar38 * dVar39 + dVar24 * dVar17;
    dVar18 = dVar35 * dVar20 + dVar23 * dVar22;
    dVar21 = dVar35 * dVar29 + dVar23 * dVar31;
    dVar30 = dVar35 * dVar39 + dVar23 * dVar17;
    dVar26 = dVar26 + dVar26;
    dVar36 = dVar36 + dVar36;
    dVar19 = dVar19 + dVar19;
    dVar18 = dVar18 + dVar18;
    dVar21 = dVar21 + dVar21;
    dVar30 = dVar30 + dVar30;
    dVar32 = dVar36 * dVar30 - dVar21 * dVar19;
    dVar1 = dVar19 * dVar18 - dVar30 * dVar26;
    dVar2 = dVar26 * dVar21 - dVar18 * dVar36;
    dVar33 = dVar32 + dVar1 + dVar2;
    dVar40 = dVar12 * dVar25 * dVar10 * dVar25 * 3.644307565376031e-14;
    if (dVar33 <= dVar40) {
      if (-dVar40 <= dVar33) {
        return 0;
      }
      iVar4 = -1;
    }
    else {
      iVar4 = 1;
    }
    dVar34 = *p3 - dVar34;
    dVar42 = p3[1] - dVar42;
    dVar40 = ABS(dVar42);
    if (ABS(dVar42) <= dVar12) {
      dVar40 = dVar12;
    }
    dVar37 = ABS(dVar34);
    if (ABS(dVar34) <= dVar40) {
      dVar37 = dVar40;
    }
    auVar3._8_8_ = dVar25;
    auVar3._0_8_ = dVar25;
    auVar27 = maxpd(auVar11,auVar3);
    auVar16._8_8_ = dVar37;
    auVar16._0_8_ = dVar12;
    auVar11 = maxpd(auVar16,auVar27);
    dVar40 = auVar11._8_8_;
    dVar12 = dVar40;
    if (dVar40 <= auVar11._0_8_) {
      dVar12 = auVar11._0_8_;
    }
    dVar28 = auVar27._8_8_;
    dVar15 = dVar28;
    if (dVar28 <= dVar12) {
      dVar15 = dVar12;
    }
    dVar12 = dVar37;
    if (dVar37 <= dVar15) {
      dVar12 = dVar15;
    }
    dVar15 = dVar10;
    if (dVar25 <= dVar10) {
      dVar15 = dVar25;
    }
    dVar41 = dVar12;
    dVar43 = dVar25;
    if ((dVar15 <= dVar12) && (dVar41 = dVar15, dVar43 = dVar12, dVar12 <= dVar25)) {
      dVar43 = dVar25;
    }
    if (dVar43 <= 2.596148429267413e+33) {
      dVar15 = dVar40;
      if (dVar41 <= dVar40) {
        dVar15 = dVar41;
      }
      dVar41 = dVar28;
      if (dVar15 <= dVar28) {
        dVar41 = dVar15;
      }
      dVar15 = dVar37;
      if (dVar41 <= dVar37) {
        dVar15 = dVar41;
      }
      if (6.0198672948616725e-50 <= dVar15) {
        dVar24 = dVar38 * dVar38 + dVar24 * dVar24;
        dVar23 = dVar35 * dVar35 + dVar23 * dVar23;
        dVar22 = dVar20 * dVar34 + dVar22 * dVar42;
        dVar20 = dVar29 * dVar34 + dVar31 * dVar42;
        dVar17 = dVar39 * dVar34 + dVar17 * dVar42;
        dVar34 = dVar33 * (dVar34 * dVar34 + dVar42 * dVar42) -
                 ((dVar2 + (dVar18 - dVar21) * dVar24 + (dVar36 - dVar26) * dVar23) *
                  (dVar17 + dVar17) +
                 (dVar1 + (dVar30 - dVar18) * dVar24 + (dVar26 - dVar19) * dVar23) *
                 (dVar20 + dVar20) +
                 (dVar32 + (dVar21 - dVar30) * dVar24 + (dVar19 - dVar36) * dVar23) *
                 (dVar22 + dVar22));
        dVar42 = dVar37 * dVar25 * dVar10 * dVar28 * dVar40 * dVar12 * 4.675444716138007e-13;
        if (dVar34 <= dVar42) {
          if (-dVar42 <= dVar34) {
            return 0;
          }
          iVar5 = -1;
        }
        else {
          iVar5 = 1;
        }
        iVar5 = iVar5 * iVar4;
      }
    }
  }
  return iVar5;
}

Assistant:

inline int side3_2d_filter( const double* p0, const double* p1, const double* p2, const double* p3, const double* q0, const double* q1, const double* q2) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double l1;
    l1 = (1 * ((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double l2;
    l2 = (1 * ((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)));
    double p3_0_p0_0 = (p3[0] - p0[0]);
    double p3_1_p0_1 = (p3[1] - p0[1]);
    double l3;
    l3 = (1 * ((p3_0_p0_0 * p3_0_p0_0) + (p3_1_p0_1 * p3_1_p0_1)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double a10;
    a10 = (2 * ((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double a11;
    a11 = (2 * ((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)));
    double q2_0_p0_0 = (q2[0] - p0[0]);
    double q2_1_p0_1 = (q2[1] - p0[1]);
    double a12;
    a12 = (2 * ((p1_0_p0_0 * q2_0_p0_0) + (p1_1_p0_1 * q2_1_p0_1)));
    double a20;
    a20 = (2 * ((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)));
    double a21;
    a21 = (2 * ((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)));
    double a22;
    a22 = (2 * ((p2_0_p0_0 * q2_0_p0_0) + (p2_1_p0_1 * q2_1_p0_1)));
    double a30;
    a30 = (2 * ((p3_0_p0_0 * q0_0_p0_0) + (p3_1_p0_1 * q0_1_p0_1)));
    double a31;
    a31 = (2 * ((p3_0_p0_0 * q1_0_p0_0) + (p3_1_p0_1 * q1_1_p0_1)));
    double a32;
    a32 = (2 * ((p3_0_p0_0 * q2_0_p0_0) + (p3_1_p0_1 * q2_1_p0_1)));
    double b00;
    b00 = ((a11 * a22) - (a12 * a21));
    double b01;
    b01 = (a21 - a22);
    double b02;
    b02 = (a12 - a11);
    double b10;
    b10 = ((a12 * a20) - (a10 * a22));
    double b11;
    b11 = (a22 - a20);
    double b12;
    b12 = (a10 - a12);
    double b20;
    b20 = ((a10 * a21) - (a11 * a20));
    double b21;
    b21 = (a20 - a21);
    double b22;
    b22 = (a11 - a10);
    double Delta;
    Delta = ((b00 + b10) + b20);
    double DeltaLambda0;
    DeltaLambda0 = (((b01 * l1) + (b02 * l2)) + b00);
    double DeltaLambda1;
    DeltaLambda1 = (((b11 * l1) + (b12 * l2)) + b10);
    double DeltaLambda2;
    DeltaLambda2 = (((b21 * l1) + (b22 * l2)) + b20);
    double r;
    r = ((Delta * l3) - (((a30 * DeltaLambda0) + (a31 * DeltaLambda1)) + (a32 * DeltaLambda2)));
    double eps;
    double max1 = fabs(p2_0_p0_0);
    if( (max1 < fabs(p2_1_p0_1)) )
    {
        max1 = fabs(p2_1_p0_1);
    } 
    double max2 = fabs(q0_0_p0_0);
    if( (max2 < fabs(q0_1_p0_1)) )
    {
        max2 = fabs(q0_1_p0_1);
    } 
    if( (max2 < fabs(q1_0_p0_0)) )
    {
        max2 = fabs(q1_0_p0_0);
    } 
    if( (max2 < fabs(q1_1_p0_1)) )
    {
        max2 = fabs(q1_1_p0_1);
    } 
    if( (max2 < fabs(q2_0_p0_0)) )
    {
        max2 = fabs(q2_0_p0_0);
    } 
    if( (max2 < fabs(q2_1_p0_1)) )
    {
        max2 = fabs(q2_1_p0_1);
    } 
    double max3 = fabs(p1_0_p0_0);
    if( (max3 < fabs(p1_1_p0_1)) )
    {
        max3 = fabs(p1_1_p0_1);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max2;
    upper_bound_1 = max2;
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    else 
    {
        if( (max1 > upper_bound_1) )
        {
            upper_bound_1 = max1;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (lower_bound_1 < 2.79532528033945620759e-74) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 2.59614842926741294957e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (3.64430756537603111258e-14 * (((max3 * max2) * max1) * max2));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    double max4 = max2;
    if( (max4 < max1) )
    {
        max4 = max1;
    } 
    if( (max4 < max3) )
    {
        max4 = max3;
    } 
    double max5 = max2;
    if( (max5 < max3) )
    {
        max5 = max3;
    } 
    double max6 = max2;
    if( (max6 < max3) )
    {
        max6 = max3;
    } 
    if( (max5 < max6) )
    {
        max5 = max6;
    } 
    double max7 = max3;
    if( (max7 < fabs(p3_1_p0_1)) )
    {
        max7 = fabs(p3_1_p0_1);
    } 
    if( (max7 < fabs(p3_0_p0_0)) )
    {
        max7 = fabs(p3_0_p0_0);
    } 
    if( (max5 < max7) )
    {
        max5 = max7;
    } 
    if( (max4 < max5) )
    {
        max4 = max5;
    } 
    if( (max4 < max6) )
    {
        max4 = max6;
    } 
    if( (max4 < max7) )
    {
        max4 = max7;
    } 
    int r_sign;
    int int_tmp_result_FFWKCAA;
    lower_bound_1 = max2;
    upper_bound_1 = max2;
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    if( (max4 < lower_bound_1) )
    {
        lower_bound_1 = max4;
    } 
    else 
    {
        if( (max4 > upper_bound_1) )
        {
            upper_bound_1 = max4;
        } 
    } 
    if( (max5 < lower_bound_1) )
    {
        lower_bound_1 = max5;
    } 
    if( (max6 < lower_bound_1) )
    {
        lower_bound_1 = max6;
    } 
    if( (max7 < lower_bound_1) )
    {
        lower_bound_1 = max7;
    } 
    if( (lower_bound_1 < 6.01986729486167248087e-50) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 2.59614842926741294957e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (4.67544471613800658534e-13 * (((((max7 * max2) * max1) * max6) * max5) * max4));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    r_sign = int_tmp_result_FFWKCAA;
    return (Delta_sign * r_sign);
}